

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppendWithAnnotations.cpp
# Opt level: O0

EStatusCode EmbedPagesInPDF(PDFWriter *inTargetWriter,string *inSourcePDF)

{
  ObjectIDType OVar1;
  bool bVar2;
  EPDFObjectType EVar3;
  DocumentContext *pDVar4;
  PDFParsingOptions *inOptions;
  PDFParser *pPVar5;
  PDFDictionary *pPVar6;
  PDFDictionary *pPVar7;
  PDFObject *pPVar8;
  ObjectsContext *this;
  EStatusCodeAndObjectIDType EVar9;
  undefined1 local_100 [8];
  EStatusCodeAndObjectIDTypeList result;
  ObjectsContext *objectsContext;
  string local_c8;
  undefined1 local_a8 [8];
  RefCountPtr<PDFObject> annotsObject;
  ObjectIDType annotsRef;
  string local_88;
  undefined1 local_68 [8];
  RefCountPtr<PDFDictionary> pageDictionary;
  unsigned_long i;
  unsigned_long pagesCount;
  undefined1 local_38 [8];
  AnnotationsWriter annotationsWriter;
  PDFDocumentCopyingContext *copyingContext;
  EStatusCode status;
  string *inSourcePDF_local;
  PDFWriter *inTargetWriter_local;
  
  copyingContext._4_4_ = eSuccess;
  AnnotationsWriter::AnnotationsWriter((AnnotationsWriter *)local_38);
  pDVar4 = PDFWriter::GetDocumentContext(inTargetWriter);
  PDFHummus::DocumentContext::AddDocumentContextExtender
            (pDVar4,(IDocumentContextExtender *)local_38);
  inOptions = PDFParsingOptions::DefaultPDFParsingOptions();
  annotationsWriter.mAnnotationObjectRef =
       (ObjectIDType)PDFWriter::CreatePDFCopyingContext(inTargetWriter,inSourcePDF,inOptions);
  if ((PDFDocumentCopyingContext *)annotationsWriter.mAnnotationObjectRef ==
      (PDFDocumentCopyingContext *)0x0) {
    copyingContext._4_4_ = eFailure;
  }
  else {
    pPVar5 = PDFDocumentCopyingContext::GetSourceDocumentParser
                       ((PDFDocumentCopyingContext *)annotationsWriter.mAnnotationObjectRef);
    pPVar6 = (PDFDictionary *)PDFParser::GetPagesCount(pPVar5);
    for (pageDictionary.mValue = (PDFDictionary *)0x0;
        pageDictionary.mValue < pPVar6 && copyingContext._4_4_ == eSuccess;
        pageDictionary.mValue =
             (PDFDictionary *)
             ((long)&((pageDictionary.mValue)->super_PDFObject).super_RefCountObject.
                     _vptr_RefCountObject + 1)) {
      pPVar5 = PDFDocumentCopyingContext::GetSourceDocumentParser
                         ((PDFDocumentCopyingContext *)annotationsWriter.mAnnotationObjectRef);
      pPVar7 = PDFParser::ParsePage(pPVar5,(unsigned_long)pageDictionary.mValue);
      RefCountPtr<PDFDictionary>::RefCountPtr((RefCountPtr<PDFDictionary> *)local_68,pPVar7);
      pPVar7 = RefCountPtr<PDFDictionary>::operator->((RefCountPtr<PDFDictionary> *)local_68);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,"Annots",(allocator<char> *)((long)&annotsRef + 7));
      bVar2 = PDFDictionary::Exists(pPVar7,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::allocator<char>::~allocator((allocator<char> *)((long)&annotsRef + 7));
      if (bVar2) {
        pPVar7 = RefCountPtr<PDFDictionary>::operator->((RefCountPtr<PDFDictionary> *)local_68);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c8,"Annots",(allocator<char> *)((long)&objectsContext + 7));
        pPVar8 = PDFDictionary::QueryDirectObject(pPVar7,&local_c8);
        RefCountPtr<PDFObject>::RefCountPtr((RefCountPtr<PDFObject> *)local_a8,pPVar8);
        std::__cxx11::string::~string((string *)&local_c8);
        std::allocator<char>::~allocator((allocator<char> *)((long)&objectsContext + 7));
        pPVar8 = RefCountPtr<PDFObject>::operator->((RefCountPtr<PDFObject> *)local_a8);
        EVar3 = PDFObject::GetType(pPVar8);
        if (EVar3 == ePDFObjectIndirectObjectReference) {
          pPVar8 = RefCountPtr<PDFObject>::GetPtr((RefCountPtr<PDFObject> *)local_a8);
          annotsObject.mValue = (PDFObject *)pPVar8[1].super_RefCountObject._vptr_RefCountObject;
LAB_0013aa63:
          AnnotationsWriter::SetAnnotationObjectReference
                    ((AnnotationsWriter *)local_38,(ObjectIDType)annotsObject.mValue);
          result.second.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          _M_node._M_size._4_4_ = 0;
        }
        else {
          this = PDFWriter::GetObjectsContext(inTargetWriter);
          annotsObject.mValue = (PDFObject *)ObjectsContext::StartNewIndirectObject(this);
          OVar1 = annotationsWriter.mAnnotationObjectRef;
          if (annotsObject.mValue == (PDFObject *)0x0) {
            copyingContext._4_4_ = eFailure;
            result.second.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            _M_node._M_size._4_4_ = 4;
          }
          else {
            pPVar8 = RefCountPtr<PDFObject>::GetPtr((RefCountPtr<PDFObject> *)local_a8);
            PDFDocumentCopyingContext::CopyDirectObjectWithDeepCopy_abi_cxx11_
                      ((EStatusCodeAndObjectIDTypeList *)local_100,
                       (PDFDocumentCopyingContext *)OVar1,pPVar8);
            copyingContext._4_4_ = local_100._0_4_;
            if (local_100._0_4_ == eSuccess) {
              ObjectsContext::EndIndirectObject(this);
              copyingContext._4_4_ =
                   PDFDocumentCopyingContext::CopyNewObjectsForDirectObject
                             ((PDFDocumentCopyingContext *)annotationsWriter.mAnnotationObjectRef,
                              (ObjectIDTypeList *)&result);
              if (copyingContext._4_4_ == eSuccess) {
                result.second.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl._M_node._M_size._4_4_ = 0;
              }
              else {
                result.second.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl._M_node._M_size._4_4_ = 4;
              }
            }
            else {
              result.second.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              _M_node._M_size._4_4_ = 4;
            }
            std::
            pair<PDFHummus::EStatusCode,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>
            ::~pair((pair<PDFHummus::EStatusCode,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>
                     *)local_100);
            if (result.second.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl._M_node._M_size._4_4_ == 0) goto LAB_0013aa63;
          }
        }
        RefCountPtr<PDFObject>::~RefCountPtr((RefCountPtr<PDFObject> *)local_a8);
        if (result.second.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            _M_node._M_size._4_4_ == 0) goto LAB_0013aaa7;
      }
      else {
LAB_0013aaa7:
        EVar9 = PDFDocumentCopyingContext::AppendPDFPageFromPDF
                          ((PDFDocumentCopyingContext *)annotationsWriter.mAnnotationObjectRef,
                           (unsigned_long)pageDictionary.mValue);
        copyingContext._4_4_ = EVar9.first;
        result.second.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        _M_node._M_size._4_4_ = 0;
      }
      RefCountPtr<PDFDictionary>::~RefCountPtr((RefCountPtr<PDFDictionary> *)local_68);
      if (result.second.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          _M_node._M_size._4_4_ != 0) break;
    }
  }
  OVar1 = annotationsWriter.mAnnotationObjectRef;
  if (annotationsWriter.mAnnotationObjectRef != 0) {
    PDFDocumentCopyingContext::~PDFDocumentCopyingContext
              ((PDFDocumentCopyingContext *)annotationsWriter.mAnnotationObjectRef);
    operator_delete((void *)OVar1,0xd0);
  }
  pDVar4 = PDFWriter::GetDocumentContext(inTargetWriter);
  PDFHummus::DocumentContext::RemoveDocumentContextExtender
            (pDVar4,(IDocumentContextExtender *)local_38);
  result.second.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node.
  _M_size._4_4_ = 1;
  AnnotationsWriter::~AnnotationsWriter((AnnotationsWriter *)local_38);
  return copyingContext._4_4_;
}

Assistant:

EStatusCode EmbedPagesInPDF(PDFWriter* inTargetWriter, const string& inSourcePDF)
{
	EStatusCode status = eSuccess;
	PDFDocumentCopyingContext* copyingContext;
	AnnotationsWriter annotationsWriter;
	
	inTargetWriter->GetDocumentContext().AddDocumentContextExtender(&annotationsWriter);
	do
	{

		copyingContext = inTargetWriter->CreatePDFCopyingContext(inSourcePDF);
		if(!copyingContext)
		{
			status = eFailure;
			break;
		}

		unsigned long pagesCount = copyingContext->GetSourceDocumentParser()->GetPagesCount();
		for(unsigned long i=0; i < pagesCount && eSuccess == status; ++i)
		{
			RefCountPtr<PDFDictionary> pageDictionary(copyingContext->GetSourceDocumentParser()->ParsePage(i));

			if(pageDictionary->Exists("Annots")) {
				// just copy the annots object into an indirect object, if it's not already that...later we can just attach the ref to the page.
				// copying will take care of recreating the annots object and internal object in whatever way there are in the original document,
				// so no need ot worry about whether they are references or direct objects
				ObjectIDType annotsRef;
				RefCountPtr<PDFObject> annotsObject = pageDictionary->QueryDirectObject("Annots");

				if(annotsObject->GetType() == PDFObject::ePDFObjectIndirectObjectReference) {
					annotsRef = ((PDFIndirectObjectReference*)(annotsObject.GetPtr()))->mObjectID;
				} else {
					// direct object. recreate as indirect, for the sake of simplicity. after its done copying, copy what indirect objects
					// it refers to (indirect annotation objects...normally)
					ObjectsContext& objectsContext = inTargetWriter->GetObjectsContext();

					annotsRef = objectsContext.StartNewIndirectObject();	
					if(annotsRef == 0) {
						status = eFailure;
						break;
					}
					EStatusCodeAndObjectIDTypeList result = copyingContext->CopyDirectObjectWithDeepCopy(annotsObject.GetPtr());

					status = result.first;
					if(status != eSuccess)
					 	break;

					objectsContext.EndIndirectObject();

					// done copying the annots object, now copy its depenencies
					status = copyingContext->CopyNewObjectsForDirectObject(result.second);
					if(status != eSuccess)
						break;
				}

				// report to end page handler, so it can use this reference when writing the page
				annotationsWriter.SetAnnotationObjectReference(annotsRef);

			}

			status = copyingContext->AppendPDFPageFromPDF(i).first;

		}
	} while(false);

	delete copyingContext;
	inTargetWriter->GetDocumentContext().RemoveDocumentContextExtender(&annotationsWriter);
	return status;
}